

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  ulong *puVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong unaff_R12;
  size_t mask;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  ulong uVar22;
  undefined1 auVar25 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  float fVar41;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar42 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  uint uVar51;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar52 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar71 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong local_1678;
  undefined1 local_1640 [16];
  ulong local_1628;
  ulong local_1620;
  ulong local_1618;
  ulong local_1610;
  ulong local_1608;
  ulong *local_1600;
  Scene *local_15f8;
  ulong *local_15f0;
  ulong local_15e8;
  RTCFilterFunctionNArguments local_15e0;
  RTCHitN local_15b0 [16];
  undefined1 local_15a0 [16];
  undefined1 local_1590 [16];
  undefined1 local_1580 [16];
  undefined1 local_1570 [16];
  undefined1 local_1560 [16];
  undefined1 local_1550 [16];
  uint local_1540;
  uint uStack_153c;
  uint uStack_1538;
  uint uStack_1534;
  uint uStack_1530;
  uint uStack_152c;
  uint uStack_1528;
  uint uStack_1524;
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  byte local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220;
  size_t local_1200;
  ulong local_11f8 [569];
  undefined1 auVar24 [16];
  
  local_1200 = root.ptr;
  auVar27 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar60 = ZEXT3264(auVar27);
  auVar28 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar61 = ZEXT3264(auVar28);
  auVar29 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar62 = ZEXT3264(auVar29);
  auVar23 = vmulss_avx512f(auVar27._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar40._0_4_ = auVar23._0_4_;
  auVar40._4_4_ = auVar40._0_4_;
  auVar40._8_4_ = auVar40._0_4_;
  auVar40._12_4_ = auVar40._0_4_;
  auVar40._16_4_ = auVar40._0_4_;
  auVar40._20_4_ = auVar40._0_4_;
  auVar40._24_4_ = auVar40._0_4_;
  auVar40._28_4_ = auVar40._0_4_;
  auVar23 = vmulss_avx512f(auVar28._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar39._0_4_ = auVar23._0_4_;
  auVar39._4_4_ = auVar39._0_4_;
  auVar39._8_4_ = auVar39._0_4_;
  auVar39._12_4_ = auVar39._0_4_;
  auVar39._16_4_ = auVar39._0_4_;
  auVar39._20_4_ = auVar39._0_4_;
  auVar39._24_4_ = auVar39._0_4_;
  auVar39._28_4_ = auVar39._0_4_;
  auVar23 = vmulss_avx512f(auVar29._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar29._0_4_ = auVar23._0_4_;
  auVar29._4_4_ = auVar29._0_4_;
  auVar29._8_4_ = auVar29._0_4_;
  auVar29._12_4_ = auVar29._0_4_;
  auVar29._16_4_ = auVar29._0_4_;
  auVar29._20_4_ = auVar29._0_4_;
  auVar29._24_4_ = auVar29._0_4_;
  auVar29._28_4_ = auVar29._0_4_;
  local_1608 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1610 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_1618 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1620 = local_1608 ^ 0x20;
  local_1628 = local_1610 ^ 0x20;
  uVar17 = local_1618 ^ 0x20;
  auVar27 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar63 = ZEXT3264(auVar27);
  auVar28 = vxorps_avx512vl(auVar40,auVar27);
  auVar64 = ZEXT3264(auVar28);
  auVar28 = vxorps_avx512vl(auVar39,auVar27);
  auVar65 = ZEXT3264(auVar28);
  auVar27 = vxorps_avx512vl(auVar29,auVar27);
  auVar66 = ZEXT3264(auVar27);
  auVar27 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar67 = ZEXT3264(auVar27);
  auVar27 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar68 = ZEXT3264(auVar27);
  auVar23 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar69 = ZEXT1664(auVar23);
  auVar27 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar70 = ZEXT3264(auVar27);
  auVar23 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar71 = ZEXT1664(auVar23);
  puVar13 = local_11f8;
  do {
    local_15f0 = puVar13;
    if (local_15f0 == &local_1200) break;
    local_1600 = local_15f0 + -1;
    uVar19 = local_15f0[-1];
    do {
      if ((uVar19 & 8) == 0) {
        auVar27 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar19 + 0x40 + local_1608),auVar64._0_32_,
                             auVar60._0_32_);
        auVar28 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar19 + 0x40 + local_1610),auVar65._0_32_,
                             auVar61._0_32_);
        auVar27 = vpmaxsd_avx2(auVar27,auVar28);
        auVar28 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar19 + 0x40 + local_1618),auVar66._0_32_,
                             auVar62._0_32_);
        auVar28 = vpmaxsd_avx512vl(auVar28,auVar67._0_32_);
        auVar27 = vpmaxsd_avx2(auVar27,auVar28);
        auVar28 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar19 + 0x40 + local_1620),auVar64._0_32_,
                             auVar60._0_32_);
        auVar29 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar19 + 0x40 + local_1628),auVar65._0_32_,
                             auVar61._0_32_);
        auVar28 = vpminsd_avx2(auVar28,auVar29);
        auVar29 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar19 + 0x40 + uVar17),auVar66._0_32_,
                             auVar62._0_32_);
        auVar29 = vpminsd_avx512vl(auVar29,auVar68._0_32_);
        auVar28 = vpminsd_avx2(auVar28,auVar29);
        uVar8 = vpcmpd_avx512vl(auVar27,auVar28,2);
        unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)(byte)uVar8);
      }
      if ((uVar19 & 8) == 0) {
        if (unaff_R12 == 0) {
          uVar51 = 4;
        }
        else {
          uVar18 = uVar19 & 0xfffffffffffffff0;
          lVar16 = 0;
          for (uVar19 = unaff_R12; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
            lVar16 = lVar16 + 1;
          }
          for (uVar14 = unaff_R12 - 1 & unaff_R12; uVar19 = *(ulong *)(uVar18 + lVar16 * 8),
              uVar14 != 0; uVar14 = uVar14 - 1 & uVar14) {
            *local_1600 = uVar19;
            local_1600 = local_1600 + 1;
            lVar16 = 0;
            for (uVar19 = uVar14; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              lVar16 = lVar16 + 1;
            }
          }
          uVar51 = 0;
        }
      }
      else {
        uVar51 = 6;
      }
    } while (uVar51 == 0);
    if (uVar51 == 6) {
      uVar51 = 0;
      local_15e8 = (ulong)((uint)uVar19 & 0xf) - 8;
      bVar20 = local_15e8 != 0;
      if (bVar20) {
        uVar19 = uVar19 & 0xfffffffffffffff0;
        uVar18 = 0;
        do {
          lVar15 = uVar18 * 0xe0;
          lVar16 = uVar19 + 0xd0 + lVar15;
          local_1420 = *(undefined8 *)(lVar16 + 0x10);
          uStack_1418 = *(undefined8 *)(lVar16 + 0x18);
          lVar16 = uVar19 + 0xc0 + lVar15;
          local_1400 = *(undefined8 *)(lVar16 + 0x10);
          uStack_13f8 = *(undefined8 *)(lVar16 + 0x18);
          uStack_13f0 = local_1400;
          uStack_13e8 = uStack_13f8;
          uStack_1410 = local_1420;
          uStack_1408 = uStack_1418;
          auVar36._16_16_ = *(undefined1 (*) [16])(uVar19 + 0x60 + lVar15);
          auVar36._0_16_ = *(undefined1 (*) [16])(uVar19 + lVar15);
          auVar37._16_16_ = *(undefined1 (*) [16])(uVar19 + 0x70 + lVar15);
          auVar37._0_16_ = *(undefined1 (*) [16])(uVar19 + 0x10 + lVar15);
          auVar46._16_16_ = *(undefined1 (*) [16])(uVar19 + 0x80 + lVar15);
          auVar46._0_16_ = *(undefined1 (*) [16])(uVar19 + 0x20 + lVar15);
          auVar23 = *(undefined1 (*) [16])(uVar19 + 0x30 + lVar15);
          auVar27._16_16_ = auVar23;
          auVar27._0_16_ = auVar23;
          auVar26 = *(undefined1 (*) [16])(uVar19 + 0x40 + lVar15);
          auVar28._16_16_ = auVar26;
          auVar28._0_16_ = auVar26;
          auVar24 = *(undefined1 (*) [16])(uVar19 + 0x50 + lVar15);
          auVar38._16_16_ = auVar24;
          auVar38._0_16_ = auVar24;
          auVar25 = *(undefined1 (*) [16])(uVar19 + 0x90 + lVar15);
          auVar47._16_16_ = auVar25;
          auVar47._0_16_ = auVar25;
          auVar25 = *(undefined1 (*) [16])(uVar19 + 0xa0 + lVar15);
          auVar48._16_16_ = auVar25;
          auVar48._0_16_ = auVar25;
          auVar25 = *(undefined1 (*) [16])(uVar19 + 0xb0 + lVar15);
          auVar49._16_16_ = auVar25;
          auVar49._0_16_ = auVar25;
          auVar27 = vsubps_avx(auVar36,auVar27);
          auVar28 = vsubps_avx(auVar37,auVar28);
          auVar29 = vsubps_avx(auVar46,auVar38);
          auVar40 = vsubps_avx(auVar47,auVar36);
          auVar39 = vsubps_avx(auVar48,auVar37);
          auVar38 = vsubps_avx(auVar49,auVar46);
          auVar30._4_4_ = auVar28._4_4_ * auVar38._4_4_;
          auVar30._0_4_ = auVar28._0_4_ * auVar38._0_4_;
          auVar30._8_4_ = auVar28._8_4_ * auVar38._8_4_;
          auVar30._12_4_ = auVar28._12_4_ * auVar38._12_4_;
          auVar30._16_4_ = auVar28._16_4_ * auVar38._16_4_;
          auVar30._20_4_ = auVar28._20_4_ * auVar38._20_4_;
          auVar30._24_4_ = auVar28._24_4_ * auVar38._24_4_;
          auVar30._28_4_ = auVar23._12_4_;
          auVar25 = vfmsub231ps_fma(auVar30,auVar39,auVar29);
          auVar31._4_4_ = auVar29._4_4_ * auVar40._4_4_;
          auVar31._0_4_ = auVar29._0_4_ * auVar40._0_4_;
          auVar31._8_4_ = auVar29._8_4_ * auVar40._8_4_;
          auVar31._12_4_ = auVar29._12_4_ * auVar40._12_4_;
          auVar31._16_4_ = auVar29._16_4_ * auVar40._16_4_;
          auVar31._20_4_ = auVar29._20_4_ * auVar40._20_4_;
          auVar31._24_4_ = auVar29._24_4_ * auVar40._24_4_;
          auVar31._28_4_ = auVar26._12_4_;
          auVar26 = vfmsub231ps_fma(auVar31,auVar38,auVar27);
          auVar35._4_4_ = auVar27._4_4_ * auVar39._4_4_;
          auVar35._0_4_ = auVar27._0_4_ * auVar39._0_4_;
          auVar35._8_4_ = auVar27._8_4_ * auVar39._8_4_;
          auVar35._12_4_ = auVar27._12_4_ * auVar39._12_4_;
          auVar35._16_4_ = auVar27._16_4_ * auVar39._16_4_;
          auVar35._20_4_ = auVar27._20_4_ * auVar39._20_4_;
          auVar35._24_4_ = auVar27._24_4_ * auVar39._24_4_;
          auVar35._28_4_ = auVar24._12_4_;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar52._4_4_ = uVar1;
          auVar52._0_4_ = uVar1;
          auVar52._8_4_ = uVar1;
          auVar52._12_4_ = uVar1;
          auVar52._16_4_ = uVar1;
          auVar52._20_4_ = uVar1;
          auVar52._24_4_ = uVar1;
          auVar52._28_4_ = uVar1;
          auVar30 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
          auVar31 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
          uVar1 = *(undefined4 *)(ray + k * 4);
          auVar32._4_4_ = uVar1;
          auVar32._0_4_ = uVar1;
          auVar32._8_4_ = uVar1;
          auVar32._12_4_ = uVar1;
          auVar32._16_4_ = uVar1;
          auVar32._20_4_ = uVar1;
          auVar32._24_4_ = uVar1;
          auVar32._28_4_ = uVar1;
          auVar32 = vsubps_avx512vl(auVar36,auVar32);
          auVar24 = vfmsub231ps_fma(auVar35,auVar40,auVar28);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar33._4_4_ = uVar1;
          auVar33._0_4_ = uVar1;
          auVar33._8_4_ = uVar1;
          auVar33._12_4_ = uVar1;
          auVar33._16_4_ = uVar1;
          auVar33._20_4_ = uVar1;
          auVar33._24_4_ = uVar1;
          auVar33._28_4_ = uVar1;
          auVar33 = vsubps_avx512vl(auVar37,auVar33);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar34._4_4_ = uVar1;
          auVar34._0_4_ = uVar1;
          auVar34._8_4_ = uVar1;
          auVar34._12_4_ = uVar1;
          auVar34._16_4_ = uVar1;
          auVar34._20_4_ = uVar1;
          auVar34._24_4_ = uVar1;
          auVar34._28_4_ = uVar1;
          auVar34 = vsubps_avx512vl(auVar46,auVar34);
          auVar35 = vmulps_avx512vl(auVar30,auVar34);
          auVar35 = vfmsub231ps_avx512vl(auVar35,auVar33,auVar31);
          auVar36 = vmulps_avx512vl(auVar31,auVar32);
          auVar36 = vfmsub231ps_avx512vl(auVar36,auVar34,auVar52);
          auVar37 = vmulps_avx512vl(auVar52,auVar33);
          auVar37 = vfmsub231ps_avx512vl(auVar37,auVar32,auVar30);
          auVar31 = vmulps_avx512vl(ZEXT1632(auVar24),auVar31);
          auVar30 = vfmadd231ps_avx512vl(auVar31,ZEXT1632(auVar26),auVar30);
          local_1380 = vfmadd231ps_avx512vl(auVar30,ZEXT1632(auVar25),auVar52);
          vandps_avx512vl(local_1380,auVar70._0_32_);
          vandps_avx512vl(local_1380,auVar63._0_32_);
          auVar38 = vmulps_avx512vl(auVar38,auVar37);
          auVar39 = vfmadd231ps_avx512vl(auVar38,auVar36,auVar39);
          auVar23 = vfmadd231ps_fma(auVar39,auVar35,auVar40);
          uVar51 = local_1380._0_4_;
          local_13e0._0_4_ = (float)(uVar51 ^ auVar23._0_4_);
          uVar53 = local_1380._4_4_;
          local_13e0._4_4_ = (float)(uVar53 ^ auVar23._4_4_);
          uVar54 = local_1380._8_4_;
          local_13e0._8_4_ = (float)(uVar54 ^ auVar23._8_4_);
          uVar55 = local_1380._12_4_;
          local_13e0._12_4_ = (float)(uVar55 ^ auVar23._12_4_);
          fVar56 = local_1380._16_4_;
          local_13e0._16_4_ = fVar56;
          fVar57 = local_1380._20_4_;
          local_13e0._20_4_ = fVar57;
          fVar58 = local_1380._24_4_;
          local_13e0._24_4_ = fVar58;
          fStack_1284 = local_1380._28_4_;
          local_13e0._28_4_ = fStack_1284;
          auVar29 = vmulps_avx512vl(auVar29,auVar37);
          auVar28 = vfmadd231ps_avx512vl(auVar29,auVar28,auVar36);
          auVar23 = vfmadd231ps_fma(auVar28,auVar27,auVar35);
          local_13c0._0_4_ = (float)(uVar51 ^ auVar23._0_4_);
          local_13c0._4_4_ = (float)(uVar53 ^ auVar23._4_4_);
          local_13c0._8_4_ = (float)(uVar54 ^ auVar23._8_4_);
          local_13c0._12_4_ = (float)(uVar55 ^ auVar23._12_4_);
          local_13c0._16_4_ = fVar56;
          local_13c0._20_4_ = fVar57;
          local_13c0._24_4_ = fVar58;
          local_13c0._28_4_ = fStack_1284;
          auVar27 = auVar71._0_32_;
          uVar8 = vcmpps_avx512vl(local_13e0,auVar27,5);
          uVar5 = vcmpps_avx512vl(local_13c0,auVar27,5);
          uVar6 = vcmpps_avx512vl(local_1380,auVar27,4);
          auVar59._0_4_ = local_13e0._0_4_ + local_13c0._0_4_;
          auVar59._4_4_ = local_13e0._4_4_ + local_13c0._4_4_;
          auVar59._8_4_ = local_13e0._8_4_ + local_13c0._8_4_;
          auVar59._12_4_ = local_13e0._12_4_ + local_13c0._12_4_;
          auVar59._16_4_ = fVar56 + fVar56;
          auVar59._20_4_ = fVar57 + fVar57;
          auVar59._24_4_ = fVar58 + fVar58;
          auVar59._28_4_ = fStack_1284 + fStack_1284;
          uVar7 = vcmpps_avx512vl(auVar59,local_1380,2);
          local_1300 = (byte)uVar8 & (byte)uVar5 & (byte)uVar6 & (byte)uVar7;
          if (local_1300 != 0) {
            auVar11._4_4_ = auVar34._4_4_ * auVar24._4_4_;
            auVar11._0_4_ = auVar34._0_4_ * auVar24._0_4_;
            auVar11._8_4_ = auVar34._8_4_ * auVar24._8_4_;
            auVar11._12_4_ = auVar34._12_4_ * auVar24._12_4_;
            auVar11._16_4_ = auVar34._16_4_ * 0.0;
            auVar11._20_4_ = auVar34._20_4_ * 0.0;
            auVar11._24_4_ = auVar34._24_4_ * 0.0;
            auVar11._28_4_ = auVar34._28_4_;
            auVar23 = vfmadd213ps_fma(auVar33,ZEXT1632(auVar26),auVar11);
            auVar23 = vfmadd213ps_fma(auVar32,ZEXT1632(auVar25),ZEXT1632(auVar23));
            local_13a0._0_4_ = (float)(uVar51 ^ auVar23._0_4_);
            local_13a0._4_4_ = (float)(uVar53 ^ auVar23._4_4_);
            local_13a0._8_4_ = (float)(uVar54 ^ auVar23._8_4_);
            local_13a0._12_4_ = (float)(uVar55 ^ auVar23._12_4_);
            local_13a0._16_4_ = fVar56;
            local_13a0._20_4_ = fVar57;
            local_13a0._24_4_ = fVar58;
            local_13a0._28_4_ = fStack_1284;
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar9._4_4_ = uVar1;
            auVar9._0_4_ = uVar1;
            auVar9._8_4_ = uVar1;
            auVar9._12_4_ = uVar1;
            auVar9._16_4_ = uVar1;
            auVar9._20_4_ = uVar1;
            auVar9._24_4_ = uVar1;
            auVar9._28_4_ = uVar1;
            auVar27 = vmulps_avx512vl(local_1380,auVar9);
            uVar8 = vcmpps_avx512vl(auVar27,local_13a0,1);
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar10._4_4_ = uVar1;
            auVar10._0_4_ = uVar1;
            auVar10._8_4_ = uVar1;
            auVar10._12_4_ = uVar1;
            auVar10._16_4_ = uVar1;
            auVar10._20_4_ = uVar1;
            auVar10._24_4_ = uVar1;
            auVar10._28_4_ = uVar1;
            auVar27 = vmulps_avx512vl(local_1380,auVar10);
            uVar5 = vcmpps_avx512vl(local_13a0,auVar27,2);
            local_1300 = (byte)uVar8 & (byte)uVar5 & local_1300;
            if (local_1300 != 0) {
              local_1360 = ZEXT1632(auVar25);
              local_1340 = ZEXT1632(auVar26);
              local_1320 = ZEXT1632(auVar24);
              local_1220 = 0xf0;
              local_15f8 = context->scene;
              auVar27 = vrcp14ps_avx512vl(local_1380);
              auVar50._8_4_ = 0x3f800000;
              auVar50._0_8_ = &DAT_3f8000003f800000;
              auVar50._12_4_ = 0x3f800000;
              auVar50._16_4_ = 0x3f800000;
              auVar50._20_4_ = 0x3f800000;
              auVar50._24_4_ = 0x3f800000;
              auVar50._28_4_ = 0x3f800000;
              auVar23 = vfnmadd213ps_fma(local_1380,auVar27,auVar50);
              auVar23 = vfmadd132ps_fma(ZEXT1632(auVar23),auVar27,auVar27);
              fVar41 = auVar23._0_4_;
              fVar43 = auVar23._4_4_;
              fVar44 = auVar23._8_4_;
              fVar45 = auVar23._12_4_;
              local_12a0[0] = fVar41 * local_13a0._0_4_;
              local_12a0[1] = fVar43 * local_13a0._4_4_;
              local_12a0[2] = fVar44 * local_13a0._8_4_;
              local_12a0[3] = fVar45 * local_13a0._12_4_;
              fStack_1290 = fVar56 * 0.0;
              fStack_128c = fVar57 * 0.0;
              fStack_1288 = fVar58 * 0.0;
              auVar12._4_4_ = fVar43 * local_13e0._4_4_;
              auVar12._0_4_ = fVar41 * local_13e0._0_4_;
              auVar12._8_4_ = fVar44 * local_13e0._8_4_;
              auVar12._12_4_ = fVar45 * local_13e0._12_4_;
              auVar12._16_4_ = fVar56 * 0.0;
              auVar12._20_4_ = fVar57 * 0.0;
              auVar12._24_4_ = fVar58 * 0.0;
              auVar12._28_4_ = fStack_1284;
              auVar27 = vminps_avx(auVar12,auVar50);
              auVar42._0_4_ = fVar41 * local_13c0._0_4_;
              auVar42._4_4_ = fVar43 * local_13c0._4_4_;
              auVar42._8_4_ = fVar44 * local_13c0._8_4_;
              auVar42._12_4_ = fVar45 * local_13c0._12_4_;
              auVar42._16_4_ = fVar56 * 0.0;
              auVar42._20_4_ = fVar57 * 0.0;
              auVar42._24_4_ = fVar58 * 0.0;
              auVar42._28_4_ = 0;
              auVar28 = vminps_avx(auVar42,auVar50);
              auVar29 = vsubps_avx(auVar50,auVar27);
              auVar40 = vsubps_avx(auVar50,auVar28);
              local_12c0 = vblendps_avx(auVar28,auVar29,0xf0);
              local_12e0 = vblendps_avx(auVar27,auVar40,0xf0);
              fVar56 = (float)DAT_02060940;
              local_1280._0_4_ = auVar25._0_4_ * fVar56;
              fVar57 = DAT_02060940._4_4_;
              local_1280._4_4_ = auVar25._4_4_ * fVar57;
              fVar58 = DAT_02060940._8_4_;
              local_1280._8_4_ = auVar25._8_4_ * fVar58;
              fVar41 = DAT_02060940._12_4_;
              local_1280._12_4_ = auVar25._12_4_ * fVar41;
              fVar43 = DAT_02060940._16_4_;
              local_1280._16_4_ = fVar43 * 0.0;
              fVar44 = DAT_02060940._20_4_;
              local_1280._20_4_ = fVar44 * 0.0;
              fVar45 = DAT_02060940._24_4_;
              local_1280._24_4_ = fVar45 * 0.0;
              local_1280._28_4_ = 0;
              local_1260._0_4_ = auVar26._0_4_ * fVar56;
              local_1260._4_4_ = auVar26._4_4_ * fVar57;
              local_1260._8_4_ = auVar26._8_4_ * fVar58;
              local_1260._12_4_ = auVar26._12_4_ * fVar41;
              local_1260._16_4_ = fVar43 * 0.0;
              local_1260._20_4_ = fVar44 * 0.0;
              local_1260._24_4_ = fVar45 * 0.0;
              local_1260._28_4_ = 0;
              local_1240._4_4_ = auVar24._4_4_ * fVar57;
              local_1240._0_4_ = auVar24._0_4_ * fVar56;
              local_1240._8_4_ = auVar24._8_4_ * fVar58;
              local_1240._12_4_ = auVar24._12_4_ * fVar41;
              local_1240._16_4_ = fVar43 * 0.0;
              local_1240._20_4_ = fVar44 * 0.0;
              local_1240._24_4_ = fVar45 * 0.0;
              local_1240._28_4_ = 0;
              local_1678 = (ulong)local_1300;
              do {
                auVar23 = auVar71._0_16_;
                uVar14 = 0;
                for (uVar22 = local_1678; (uVar22 & 1) == 0;
                    uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                  uVar14 = uVar14 + 1;
                }
                pGVar3 = (local_15f8->geometries).items[*(uint *)((long)&local_1400 + uVar14 * 4)].
                         ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  local_1678 = local_1678 ^ 1L << (uVar14 & 0x3f);
                  bVar21 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar21 = false;
                }
                else {
                  local_1520 = vmovdqa64_avx512vl(auVar68._0_32_);
                  local_1500 = vmovdqa64_avx512vl(auVar67._0_32_);
                  local_14e0 = auVar66._0_32_;
                  local_14c0 = auVar65._0_32_;
                  local_14a0 = auVar64._0_32_;
                  local_1480 = auVar62._0_32_;
                  local_1460 = auVar61._0_32_;
                  local_1440 = auVar60._0_32_;
                  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
                  uVar22 = (ulong)(uint)((int)uVar14 * 4);
                  uVar2 = *(undefined4 *)(local_12e0 + uVar22);
                  local_1580._4_4_ = uVar2;
                  local_1580._0_4_ = uVar2;
                  local_1580._8_4_ = uVar2;
                  local_1580._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_12c0 + uVar22);
                  local_1570._4_4_ = uVar2;
                  local_1570._0_4_ = uVar2;
                  local_1570._8_4_ = uVar2;
                  local_1570._12_4_ = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_12a0 + uVar22);
                  local_15e0.context = context->user;
                  local_1550 = vpbroadcastd_avx512vl();
                  uVar2 = *(undefined4 *)((long)&local_1420 + uVar22);
                  local_1560._4_4_ = uVar2;
                  local_1560._0_4_ = uVar2;
                  local_1560._8_4_ = uVar2;
                  local_1560._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_1280 + uVar22);
                  local_15b0._4_4_ = uVar2;
                  local_15b0._0_4_ = uVar2;
                  local_15b0._8_4_ = uVar2;
                  local_15b0._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_1260 + uVar22);
                  local_15a0._4_4_ = uVar2;
                  local_15a0._0_4_ = uVar2;
                  local_15a0._8_4_ = uVar2;
                  local_15a0._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_1240 + uVar22);
                  local_1590._4_4_ = uVar2;
                  local_1590._0_4_ = uVar2;
                  local_1590._8_4_ = uVar2;
                  local_1590._12_4_ = uVar2;
                  vpcmpeqd_avx2(ZEXT1632(local_1550),ZEXT1632(local_1550));
                  uStack_153c = (local_15e0.context)->instID[0];
                  local_1540 = uStack_153c;
                  uStack_1538 = uStack_153c;
                  uStack_1534 = uStack_153c;
                  uStack_1530 = (local_15e0.context)->instPrimID[0];
                  uStack_152c = uStack_1530;
                  uStack_1528 = uStack_1530;
                  uStack_1524 = uStack_1530;
                  auVar26 = vmovdqa64_avx512vl(auVar69._0_16_);
                  local_1640 = vmovdqa64_avx512vl(auVar69._0_16_);
                  local_15e0.valid = (int *)local_1640;
                  local_15e0.geometryUserPtr = pGVar3->userPtr;
                  local_15e0.hit = local_15b0;
                  local_15e0.N = 4;
                  local_15e0.ray = (RTCRayN *)ray;
                  if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar3->occlusionFilterN)(&local_15e0);
                  }
                  uVar22 = vptestmd_avx512vl(local_1640,local_1640);
                  if ((uVar22 & 0xf) == 0) {
                    bVar21 = true;
                  }
                  else {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var4)(&local_15e0);
                    }
                    uVar22 = vptestmd_avx512vl(local_1640,local_1640);
                    uVar22 = uVar22 & 0xf;
                    auVar24 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar21 = (bool)((byte)uVar22 & 1);
                    auVar25._0_4_ =
                         (uint)bVar21 * auVar24._0_4_ |
                         (uint)!bVar21 * *(int *)(local_15e0.ray + 0x80);
                    bVar21 = (bool)((byte)(uVar22 >> 1) & 1);
                    auVar25._4_4_ =
                         (uint)bVar21 * auVar24._4_4_ |
                         (uint)!bVar21 * *(int *)(local_15e0.ray + 0x84);
                    bVar21 = (bool)((byte)(uVar22 >> 2) & 1);
                    auVar25._8_4_ =
                         (uint)bVar21 * auVar24._8_4_ |
                         (uint)!bVar21 * *(int *)(local_15e0.ray + 0x88);
                    bVar21 = SUB81(uVar22 >> 3,0);
                    auVar25._12_4_ =
                         (uint)bVar21 * auVar24._12_4_ |
                         (uint)!bVar21 * *(int *)(local_15e0.ray + 0x8c);
                    *(undefined1 (*) [16])(local_15e0.ray + 0x80) = auVar25;
                    bVar21 = (byte)uVar22 == 0;
                  }
                  if (bVar21) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar1;
                    local_1678 = local_1678 ^ 1L << (uVar14 & 0x3f);
                  }
                  auVar60 = ZEXT3264(local_1440);
                  auVar61 = ZEXT3264(local_1460);
                  auVar62 = ZEXT3264(local_1480);
                  auVar27 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar63 = ZEXT3264(auVar27);
                  auVar64 = ZEXT3264(local_14a0);
                  auVar65 = ZEXT3264(local_14c0);
                  auVar66 = ZEXT3264(local_14e0);
                  auVar27 = vmovdqa64_avx512vl(local_1500);
                  auVar67 = ZEXT3264(auVar27);
                  auVar27 = vmovdqa64_avx512vl(local_1520);
                  auVar68 = ZEXT3264(auVar27);
                  auVar26 = vmovdqa64_avx512vl(auVar26);
                  auVar69 = ZEXT1664(auVar26);
                  auVar27 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar70 = ZEXT3264(auVar27);
                  auVar23 = vxorps_avx512vl(auVar23,auVar23);
                  auVar71 = ZEXT1664(auVar23);
                }
                uVar51 = 0;
                if (!bVar21) {
                  if (bVar20) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    uVar51 = 1;
                  }
                  goto LAB_00848a86;
                }
              } while (local_1678 != 0);
            }
          }
          uVar51 = 0;
          uVar18 = uVar18 + 1;
          bVar20 = uVar18 < local_15e8;
        } while (uVar18 != local_15e8);
      }
    }
LAB_00848a86:
    puVar13 = local_1600;
  } while ((uVar51 & 3) == 0);
  return local_15f0 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }